

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int nWords;
  uint uVar11;
  word *pLimit;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  word *pwVar17;
  ulong uVar18;
  uint uVar19;
  word *pwVar21;
  bool bVar22;
  ulong uVar20;
  
  bVar5 = (byte)nVars;
  uVar11 = 1 << (bVar5 - 6 & 0x1f);
  if (nVars < 7) {
    uVar11 = 1;
  }
  if (0 < (int)uVar11) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicizePhase::pCopy1 + lVar7) =
           *(undefined8 *)((long)pTruth + lVar7);
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar11 << 3 != lVar7);
  }
  uVar10 = 0;
  if ((long)pTruth[(long)(int)uVar11 + -1] < 0) {
    if (0 < (int)uVar11) {
      uVar8 = 0;
      do {
        pTruth[uVar8] = ~pTruth[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
    }
    uVar10 = 1 << (bVar5 & 0x1f);
  }
  uVar13 = nVars - 1;
  uVar6 = nVars;
  if (6 < nVars) {
    do {
      uVar19 = uVar13;
      iVar12 = 1 << ((char)uVar6 - 7U & 0x1f);
      if ((int)uVar11 < 2) {
LAB_004f79d7:
        bVar22 = false;
      }
      else {
        uVar6 = uVar11 - iVar12;
        uVar13 = uVar11;
        while( true ) {
          uVar14 = uVar13 - 1;
          uVar8 = (ulong)uVar14;
          if (pTruth[(int)(uVar14 - iVar12)] != pTruth[uVar8]) break;
          uVar13 = uVar6 - iVar12;
          uVar3 = uVar13 - iVar12;
          if (uVar14 != uVar6) {
            uVar13 = uVar14;
            uVar3 = uVar6;
          }
          uVar6 = uVar3;
          if ((int)uVar13 < 2) goto LAB_004f79d7;
        }
        if (pTruth[uVar8] < pTruth[(int)(uVar14 - iVar12)]) goto LAB_004f79d7;
        if (uVar13 < 2) goto LAB_004f7a44;
        do {
          uVar13 = (uint)uVar8;
          wVar1 = pTruth[(int)(uVar13 - iVar12)];
          pTruth[(int)(uVar13 - iVar12)] = pTruth[uVar8];
          pTruth[uVar8] = wVar1;
          uVar14 = uVar6 - iVar12;
          bVar22 = uVar13 == uVar6;
          if (bVar22) {
            uVar6 = uVar14 - iVar12;
          }
          uVar9 = (ulong)uVar14;
          if (!bVar22) {
            uVar9 = uVar8;
          }
          iVar2 = (int)uVar9;
          uVar8 = (ulong)(iVar2 - 1);
        } while (1 < iVar2);
        bVar22 = true;
        if (iVar2 != 0) {
LAB_004f7a44:
          __assert_fail("w == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                        ,0x485,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
        }
      }
      uVar13 = 1 << ((byte)uVar19 & 0x1f);
      if (!bVar22) {
        uVar13 = 0;
      }
      uVar10 = uVar10 ^ uVar13;
      uVar13 = uVar19 - 1;
      uVar6 = uVar19;
    } while (6 < (int)uVar19);
    uVar13 = 5;
  }
  if (-1 < (int)uVar13) {
    uVar8 = (ulong)uVar13;
    do {
      uVar13 = 1 << ((byte)uVar8 & 0x1f);
      uVar9 = s_Truths6[uVar8];
      uVar16 = (ulong)uVar11;
      do {
        uVar20 = uVar16;
        uVar6 = 0;
        if ((int)uVar20 < 1) goto LAB_004f7adf;
        bVar4 = (byte)uVar13;
        uVar18 = pTruth[uVar20 - 1] << (bVar4 & 0x3f) & uVar9;
        uVar15 = pTruth[uVar20 - 1] & uVar9;
        uVar16 = uVar20 - 1;
      } while (uVar18 == uVar15);
      if (uVar18 <= uVar15) {
        uVar16 = uVar20 - 1 & 0xffffffff;
        do {
          pTruth[uVar16] =
               (pTruth[uVar16] & uVar9) >> (bVar4 & 0x3f) | pTruth[uVar16] << (bVar4 & 0x3f) & uVar9
          ;
          uVar16 = uVar16 - 1;
          uVar19 = (int)uVar20 - 1;
          uVar20 = (ulong)uVar19;
          uVar6 = uVar13;
        } while (0 < (int)uVar19);
      }
LAB_004f7adf:
      uVar10 = uVar10 ^ uVar6;
      bVar22 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar22);
  }
  if (0 < (int)uVar11) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7) =
           *(undefined8 *)((long)pTruth + lVar7);
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar11 << 3 != lVar7);
  }
  if ((0 < (int)uVar11) && ((1 << (bVar5 & 0x1f) & uVar10) != 0)) {
    lVar7 = 0;
    do {
      *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7) =
           ~*(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7);
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar11 << 3 != lVar7);
  }
  if (0 < nVars) {
    uVar8 = 0;
    do {
      if ((uVar10 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
        bVar5 = (byte)(1 << ((byte)uVar8 & 0x1f));
        if (uVar11 == 1) {
          Abc_TtCanonicizePhase::pCopy2[0] =
               (s_Truths6[uVar8] & Abc_TtCanonicizePhase::pCopy2[0]) >> (bVar5 & 0x3f) |
               Abc_TtCanonicizePhase::pCopy2[0] << (bVar5 & 0x3f) & s_Truths6[uVar8];
        }
        else if (uVar8 < 6) {
          if (0 < (int)uVar11) {
            uVar9 = s_Truths6[uVar8];
            lVar7 = 0;
            do {
              *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7) =
                   (*(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7) & uVar9) >>
                   (bVar5 & 0x3f) |
                   *(ulong *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7) << (bVar5 & 0x3f) & uVar9
              ;
              lVar7 = lVar7 + 8;
            } while ((ulong)uVar11 << 3 != lVar7);
          }
        }
        else if (0 < (int)uVar11) {
          bVar5 = (byte)(uVar8 - 6);
          uVar13 = 1 << (bVar5 & 0x1f);
          iVar12 = 2 << (bVar5 & 0x1f);
          uVar9 = 1;
          if (1 < (int)uVar13) {
            uVar9 = (ulong)uVar13;
          }
          pwVar21 = Abc_TtCanonicizePhase::pCopy2 + (int)uVar13;
          pwVar17 = Abc_TtCanonicizePhase::pCopy2;
          do {
            if (uVar8 - 6 != 0x1f) {
              uVar16 = 0;
              do {
                wVar1 = pwVar17[uVar16];
                pwVar17[uVar16] = pwVar21[uVar16];
                pwVar21[uVar16] = wVar1;
                uVar16 = uVar16 + 1;
              } while (uVar9 != uVar16);
            }
            pwVar17 = pwVar17 + iVar12;
            pwVar21 = pwVar21 + iVar12;
          } while (pwVar17 < Abc_TtCanonicizePhase::pCopy2 + (int)uVar11);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nVars);
  }
  if (0 < (int)uVar11) {
    lVar7 = 0;
    do {
      if (*(long *)((long)Abc_TtCanonicizePhase::pCopy1 + lVar7) !=
          *(long *)((long)Abc_TtCanonicizePhase::pCopy2 + lVar7)) {
        puts("Canonical form verification failed!");
        return uVar10;
      }
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar11 << 3 != lVar7);
  }
  return uVar10;
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}